

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

int lua_getglobal(lua_State *L,char *name)

{
  TValue *t;
  long lVar1;
  TString *key;
  TValue *slot;
  StkId pSVar2;
  
  lVar1 = *(long *)((L->l_G->l_registry).value_.f + 0x10);
  t = (TValue *)(lVar1 + 0x10);
  key = luaS_new(L,name);
  if (*(char *)(lVar1 + 0x18) == 'E') {
    slot = luaH_getstr((Table *)(t->value_).gc,key);
    if ((slot->tt_ & 0xf) != 0) {
      pSVar2 = (L->top).p;
      (pSVar2->val).value_ = slot->value_;
      (pSVar2->val).tt_ = slot->tt_;
      pSVar2 = (StkId)((L->top).offset + 0x10);
      (L->top).p = pSVar2;
      goto LAB_001076ae;
    }
  }
  else {
    slot = (TValue *)0x0;
  }
  pSVar2 = (L->top).p;
  *(TString **)pSVar2 = key;
  (pSVar2->val).tt_ = key->tt | 0x40;
  pSVar2 = (L->top).p;
  (L->top).p = pSVar2 + 1;
  luaV_finishget(L,t,&pSVar2->val,pSVar2,slot);
  pSVar2 = (StkId)(L->top).offset;
LAB_001076ae:
  return *(byte *)((long)pSVar2 + -8) & 0xf;
}

Assistant:

LUA_API int lua_getglobal (lua_State *L, const char *name) {
  const TValue *G;
  lua_lock(L);
  G = getGtable(L);
  return auxgetstr(L, G, name);
}